

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,VarDeclStmt *node)

{
  FunctionModule *pFVar1;
  BuilderContext *pBVar2;
  BBLIter bblIter;
  element_type *peVar3;
  bool bVar4;
  string *this_00;
  shared_ptr<mocker::ir::Reg> valPtr;
  string name;
  allocator<char> local_119;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  string local_e8 [32];
  shared_ptr<mocker::ir::IRInst> local_c8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  pFVar1 = this->ctx->curFunc;
  std::__cxx11::string::string
            (local_e8,(string *)
                      &((node->identifier).
                        super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->val);
  std::__cxx11::string::string(local_50,local_e8);
  makeReg((Builder *)(local_108 + 0x10),(string *)this);
  std::__cxx11::string::~string(local_50);
  pBVar2 = this->ctx;
  bblIter._M_node =
       (pFVar1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)local_118);
  local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118._0_8_;
  local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
  local_118._0_8_ = (element_type *)0x0;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::appendInstFront(pBVar2,bblIter,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
  if ((node->initExpr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
LAB_00139ca9:
    bVar4 = isBoolTy(this,&node->type);
    if (bVar4) goto LAB_00139dea;
    bVar4 = isIntTy(this,&node->type);
    if (bVar4) goto LAB_00139dea;
    pBVar2 = this->ctx;
    std::__cxx11::string::string(local_90,local_e8);
    makeReg((Builder *)local_118,(string *)this);
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"@null",&local_119);
    makeReg((Builder *)local_108,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>>
              (pBVar2,(shared_ptr<mocker::ir::Reg> *)local_118,
               (shared_ptr<mocker::ir::Reg> *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    std::__cxx11::string::~string(local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
    this_00 = local_90;
  }
  else {
    BuilderContext::getExprType((BuilderContext *)local_118,(NodeID)this->ctx);
    bVar4 = isNullTy(this,(shared_ptr<mocker::ast::Type> *)local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
    if (bVar4) goto LAB_00139ca9;
    peVar3 = (node->initExpr).
             super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
              (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    pBVar2 = this->ctx;
    std::__cxx11::string::string(local_70,local_e8);
    makeReg((Builder *)local_118,(string *)this);
    BuilderContext::getExprAddr((BuilderContext *)local_108,(NodeID)this->ctx);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>>
              (pBVar2,(shared_ptr<mocker::ir::Reg> *)local_118,
               (shared_ptr<mocker::ir::Addr> *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
    this_00 = local_70;
  }
  std::__cxx11::string::~string(this_00);
LAB_00139dea:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

void Builder::operator()(const ast::VarDeclStmt &node) const {
  auto &func = ctx.getCurFunc();
  auto name = node.identifier->val;
  auto valPtr = makeReg(name);
  ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(valPtr));

  if (node.initExpr && !isNullTy(ctx.getExprType(node.initExpr->getID()))) {
    visit(*node.initExpr);
    ctx.emplaceInst<Store>(makeReg(name),
                           ctx.getExprAddr(node.initExpr->getID()));
    return;
  }
  if (isBoolTy(node.type) || isIntTy(node.type)) {
    return;
  }
  ctx.emplaceInst<Store>(makeReg(name), makeReg("@null"));
}